

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildMaybeClass(ObjectModelBuilder *this,value *value,bool declaration)

{
  bool bVar1;
  ostream *poVar2;
  object *classObject;
  char *pcVar3;
  bool declaration_local;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  bVar1 = picojson::value::
          is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                    (value);
  if (bVar1) {
    classObject = picojson::value::
                  get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                            (value);
    this_local._7_1_ = buildClass(this,classObject,declaration);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: class");
    pcVar3 = "";
    if (declaration) {
      pcVar3 = " declaration";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," is not a JSON object..");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildMaybeClass(const picojson::value &value, bool declaration)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: class" << (declaration ? " declaration" : "") << " is not a JSON object.." << std::endl;
        return false;
    }
    return buildClass(value.get<picojson::object>(), declaration);
}